

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

MutexGlobals * absl::anon_unknown_11::GetMutexGlobals(void)

{
  anon_class_1_0_00000001 local_9;
  
  base_internal::LowLevelCallOnce<absl::(anonymous_namespace)::GetMutexGlobals()::__0>
            (&GetMutexGlobals::data.once,&local_9);
  return &GetMutexGlobals::data;
}

Assistant:

const MutexGlobals &GetMutexGlobals() {
  ABSL_CONST_INIT static MutexGlobals data;
  absl::base_internal::LowLevelCallOnce(&data.once, [&]() {
    const int num_cpus = absl::base_internal::NumCPUs();
    data.spinloop_iterations = num_cpus > 1 ? 1500 : 0;
    // If this a uniprocessor, only yield/sleep.  Otherwise, if the mode is
    // aggressive then spin many times before yielding.  If the mode is
    // gentle then spin only a few times before yielding.  Aggressive spinning
    // is used to ensure that an Unlock() call, which must get the spin lock
    // for any thread to make progress gets it without undue delay.
    if (num_cpus > 1) {
      data.mutex_sleep_limit[AGGRESSIVE] = 5000;
      data.mutex_sleep_limit[GENTLE] = 250;
    } else {
      data.mutex_sleep_limit[AGGRESSIVE] = 0;
      data.mutex_sleep_limit[GENTLE] = 0;
    }
  });
  return data;
}